

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O1

double calcErrAlgebraicRnPFocalRadialDoubleLin
                 (Vector3d *vr,Vector3d *Cr,Vector3d *wr,Vector3d *tr,double f,double rd,double r0,
                 MatrixXd *X,MatrixXd *u,int direction)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  MatrixXd *pMVar5;
  MatrixXd *pMVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  long lVar16;
  long lVar17;
  Vector3d uh;
  SrcEvaluatorType srcEvaluator;
  Matrix3d I;
  assign_op<double,_double> local_3d9;
  MatrixXd *local_3d8;
  long local_3d0;
  double local_3c8;
  MatrixXd *local_3c0;
  Vector3d *local_3b8;
  Vector3d *local_3b0;
  Vector3d *local_3a8;
  Vector3d *local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378 [3];
  SrcEvaluatorType local_360;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  double local_328 [2];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_318;
  double dStack_2f8;
  double local_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  Matrix<double,_3,_1,_0,_3,_1> local_2d0 [2];
  Vector3d local_298;
  Vector3d local_278;
  Vector3d local_258;
  undefined1 local_240 [24];
  double *local_228;
  Matrix<double,_3,_3,_0,_3,_3> *local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  double local_208;
  Matrix<double,_3,_3,_0,_3,_3> *local_200;
  Matrix<double,_3,_3,_0,_3,_3> *local_1e8;
  Matrix<double,_3,_3,_0,_3,_3> *local_1e0;
  double *local_1d0;
  long local_1c8;
  MatrixXd *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  long local_1a0;
  Vector3d *local_198;
  double local_178;
  Vector3d *local_170;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double dStack_138;
  double local_130;
  double local_128;
  double dStack_120;
  double local_118;
  Matrix<double,_3,_3,_0,_3,_3> local_108;
  Matrix<double,_3,_3,_0,_3,_3> local_c0;
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  if ((X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols < 1) {
    local_380 = 0.0;
  }
  else {
    local_3c8 = 1.0 / f;
    local_3d0 = (long)direction;
    local_380 = 0.0;
    lVar17 = 0;
    local_3d8 = X;
    local_3c0 = u;
    local_3b8 = vr;
    local_3b0 = Cr;
    local_3a8 = wr;
    local_3a0 = tr;
    local_398 = rd;
    local_390 = r0;
    do {
      pMVar6 = local_3c0;
      lVar16 = (local_3c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
      local_360.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = (local_3c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_data + lVar16 * lVar17;
      local_240._0_8_ = local_378;
      local_240._16_8_ = 1;
      local_220 = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
      uStack_218 = 0;
      local_210 = 3;
      local_318.m_dst = (DstEvaluatorType *)&local_108;
      local_318.m_src = &local_360;
      local_318.m_dstExpr = (DstXprType *)local_240;
      local_360.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = lVar16;
      local_318.m_functor = (assign_op<double,_double> *)&local_158;
      local_240._8_8_ = lVar16;
      local_228 = (double *)local_240._0_8_;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_240._0_8_;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run(&local_318);
      pMVar5 = local_3d8;
      pdVar1 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data + (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows * lVar17;
      local_378[lVar16] = (*pdVar1 * *pdVar1 + pdVar1[1] * pdVar1[1]) * local_398 + 1.0;
      local_360.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = (PointerType)0x3ff0000000000000;
      local_348 = 0;
      local_360.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      ._8_8_ = 0;
      local_360.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = 0;
      local_340 = 0x3ff0000000000000;
      local_328[0] = 0.0;
      local_338 = 0;
      uStack_330 = 0;
      local_328[1] = local_3c8;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = 1.0;
      local_388 = pdVar1[local_3d0] - local_390;
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_378[0];
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_378[1];
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_378[2];
      X_(&local_258);
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (local_3a8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[0];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (local_3a8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[1];
      local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (local_3a8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[2];
      X_(&local_278);
      local_298.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (local_3b8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[0];
      local_298.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (local_3b8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[1];
      local_298.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (local_3b8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[2];
      X_(&local_298);
      dVar15 = local_118;
      dVar14 = dStack_120;
      dVar13 = local_128;
      dVar12 = local_130;
      dVar11 = dStack_138;
      dVar10 = dStack_140;
      dVar9 = local_148;
      dVar8 = dStack_150;
      dVar7 = local_158;
      local_1c8 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
      local_240._0_8_ = (assign_op<double,_double> *)&local_158;
      local_240._8_8_ = &local_360;
      local_220 = &local_108;
      local_208 = local_388;
      local_200 = &local_78;
      local_1e8 = &local_108;
      local_1e0 = &local_c0;
      local_1d0 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_data + local_1c8 * lVar17;
      local_1b8 = pMVar5;
      local_1b0 = 0;
      local_1a8 = lVar17;
      local_1a0 = local_1c8;
      local_198 = local_3b0;
      local_178 = local_388;
      local_170 = local_3a0;
      lVar16 = 0x10;
      do {
        dVar2 = *(double *)
                 ((long)&local_360.
                         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                         .
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         .m_data + lVar16);
        dVar3 = *(double *)((long)local_378 + lVar16 + 8);
        dVar4 = *(double *)((long)local_378 + lVar16 + 0x10);
        *(double *)((long)local_328 + lVar16) = dVar4 * dVar10 + dVar3 * dVar7 + dVar2 * dVar13;
        *(double *)((long)local_328 + lVar16 + 8) = dVar4 * dVar11 + dVar3 * dVar8 + dVar2 * dVar14;
        *(double *)((long)&local_318.m_dst + lVar16) =
             dVar4 * dVar12 + dVar2 * dVar15 + dVar3 * dVar9;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x58);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,0>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>,Eigen::internal::assign_op<double,double>>
                (local_2d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)(local_240 + 0x10),&local_3d9);
      local_380 = local_380 +
                  ABS(local_2f0 *
                      local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] +
                      local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] * local_2d8 +
                      (double)local_318.m_functor *
                      local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0]) +
                  ABS(local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] * dStack_2f8 +
                      local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] * (double)local_318.m_src +
                      local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] * dStack_2e0) +
                  ABS(local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] * (double)local_318.m_dstExpr +
                      local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] * (double)local_318.m_dst +
                      local_2d0[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] * local_2e8);
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols);
  }
  return local_380;
}

Assistant:

double calcErrAlgebraicRnPFocalRadialDoubleLin(Eigen::Vector3d vr, Eigen::Vector3d Cr, Eigen::Vector3d wr, Eigen::Vector3d tr, double f, double rd, double r0, Eigen::MatrixXd X, Eigen::MatrixXd u, int direction){
    double err = 0;
    for (int i = 0; i < X.cols(); i++)
    {
        Eigen::Vector3d uh; 
        uh << u.col(i), 1 + rd*(u(0,i)*u(0,i) + u(1,i)*u(1,i));
        Eigen::Matrix3d K = Eigen::Matrix3d::Identity();
        K(2,2) = 1/f;
        Eigen::Matrix3d I = Eigen::Matrix3d::Identity();
        double rs = (u(direction,i)-r0);
        Eigen::Vector3d eq = X_(uh)*K*((I + rs*X_(wr))*(I + X_(vr))*X.col(i) + Cr + rs*tr);
        err += eq.cwiseAbs().sum();
    }
    return err;
}